

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O3

void ExchCXX::detail::host_eval_exc_vxc_inc_helper_unpolar<ExchCXX::BuiltinR2SCANL_C>
               (double scal_fact,int N,const_host_buffer_type rho,const_host_buffer_type sigma,
               const_host_buffer_type lapl,const_host_buffer_type tau,host_buffer_type eps,
               host_buffer_type vrho,host_buffer_type vsigma,host_buffer_type vlapl,
               host_buffer_type vtau)

{
  ulong uVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double e;
  double vlapl_k;
  double vsigma_k;
  double vrho_k;
  double dummy;
  double local_c0;
  double local_b8;
  ulong local_b0;
  double local_a8;
  const_host_buffer_type local_a0;
  const_host_buffer_type local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  if (0 < N) {
    uVar1 = (ulong)(uint)N;
    uVar2 = 0;
    dVar10 = scal_fact * 0.0;
    local_b8 = dVar10;
    local_b0 = uVar1;
    local_a8 = scal_fact;
    local_a0 = sigma;
    local_98 = lapl;
    do {
      local_90 = rho[uVar2];
      dVar3 = 0.0;
      dVar4 = 0.0;
      dVar5 = 0.0;
      dVar6 = 0.0;
      dVar7 = 0.0;
      dVar8 = 0.0;
      dVar9 = 0.0;
      if (1e-15 < local_90) {
        local_80 = local_98[uVar2];
        local_88 = 1.0000000000000052e-40;
        if (1.0000000000000052e-40 <= local_a0[uVar2]) {
          local_88 = local_a0[uVar2];
        }
        kernel_traits<ExchCXX::BuiltinPC07OPT_K>::eval_exc_vxc_unpolar_impl
                  (local_90,local_88,local_80,0.0,&local_c0,&local_48,&local_50,&local_58,&local_38)
        ;
        local_c0 = local_c0 * local_90;
        dVar10 = 1e-20;
        if (1e-20 <= local_c0) {
          dVar10 = local_c0;
        }
        dVar3 = local_90 * 8.0 * dVar10;
        if (local_88 <= dVar3) {
          dVar3 = local_88;
        }
        kernel_traits<ExchCXX::BuiltinR2SCAN_C>::eval_exc_vxc_unpolar_impl
                  (local_90,dVar3,local_80,dVar10,&local_60,&local_68,&local_70,&local_40,&local_78)
        ;
        uVar1 = local_b0;
        dVar3 = local_58;
        dVar4 = local_50;
        dVar5 = local_78;
        dVar6 = local_48;
        dVar7 = local_60;
        dVar8 = local_70;
        dVar9 = local_68;
        scal_fact = local_a8;
        dVar10 = local_b8;
      }
      eps[uVar2] = dVar7 * scal_fact + eps[uVar2];
      vrho[uVar2] = (dVar6 * dVar5 + dVar9) * scal_fact + vrho[uVar2];
      vsigma[uVar2] = (dVar4 * dVar5 + dVar8) * scal_fact + vsigma[uVar2];
      vtau[uVar2] = vtau[uVar2] + dVar10;
      vlapl[uVar2] = dVar3 * dVar5 * scal_fact + vlapl[uVar2];
      uVar2 = uVar2 + 1;
    } while (uVar1 != uVar2);
  }
  return;
}

Assistant:

MGGA_EXC_VXC_INC_GENERATOR( host_eval_exc_vxc_inc_helper_unpolar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    const auto lapl_i = traits::needs_laplacian ? lapl[i] : 0.0;
    double e, vr, vs, vl, vt;
    
    traits::eval_exc_vxc_unpolar( rho[i], sigma[i], lapl_i, tau[i], 
      e, vr, vs, vl, vt );
    eps[i]    += scal_fact * e;
    vrho[i]   += scal_fact * vr;
    vsigma[i] += scal_fact * vs;
    vtau[i]   += scal_fact * vt;
    if(traits::needs_laplacian) vlapl[i] += scal_fact * vl;

  }


}